

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrpcent.c
# Opt level: O0

rpcent * interpret(char *val,size_t len)

{
  int iVar1;
  rpcdata *prVar2;
  char *__s;
  char *pcVar3;
  char **ppcVar4;
  bool bVar5;
  char **local_40;
  char **q;
  char *cp;
  char *p;
  rpcdata *d;
  size_t len_local;
  char *val_local;
  
  prVar2 = _rpcdata();
  if (val == (char *)0x0) {
    __assert_fail("val != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/getrpcent.c"
                  ,0x110,"struct rpcent *interpret(char *, size_t)");
  }
  if (prVar2 == (rpcdata *)0x0) {
    val_local = (char *)0x0;
  }
  else {
    strncpy(prVar2->line,val,0x2000);
    prVar2->line[0x2000] = '\0';
    __s = prVar2->line;
    __s[len] = '\n';
    if (*__s == '#') {
      val_local = (char *)getrpcent();
    }
    else {
      pcVar3 = strpbrk(__s,"#\n");
      if (pcVar3 == (char *)0x0) {
        val_local = (char *)getrpcent();
      }
      else {
        *pcVar3 = '\0';
        q = (char **)strpbrk(__s," \t");
        if (q == (char **)0x0) {
          val_local = (char *)getrpcent();
        }
        else {
          *(char *)q = '\0';
          (prVar2->rpc).r_name = prVar2->line;
          do {
            q = (char **)((long)q + 1);
            bVar5 = true;
            if (*(char *)q != ' ') {
              bVar5 = *(char *)q == '\t';
            }
          } while (bVar5);
          iVar1 = atoi((char *)q);
          (prVar2->rpc).r_number = iVar1;
          local_40 = prVar2->rpc_aliases;
          (prVar2->rpc).r_aliases = local_40;
          q = (char **)strpbrk((char *)q," \t");
          if (q != (char **)0x0) {
            *(char *)q = '\0';
            q = (char **)((long)q + 1);
          }
          while( true ) {
            bVar5 = false;
            if (q != (char **)0x0) {
              bVar5 = *(char *)q != '\0';
            }
            if (!bVar5) break;
            if ((*(char *)q == ' ') || (*(char *)q == '\t')) {
              q = (char **)((long)q + 1);
            }
            else {
              if (local_40 < prVar2->rpc_aliases + 0x22) {
                *local_40 = (char *)q;
                local_40 = local_40 + 1;
              }
              ppcVar4 = (char **)strpbrk((char *)q," \t");
              q = ppcVar4;
              if (ppcVar4 != (char **)0x0) {
                q = (char **)((long)ppcVar4 + 1);
                *(char *)ppcVar4 = '\0';
              }
            }
          }
          *local_40 = (char *)0x0;
          val_local = (char *)&prVar2->rpc;
        }
      }
    }
  }
  return (rpcent *)val_local;
}

Assistant:

static struct rpcent *
interpret(char *val, size_t len)
{
	struct rpcdata *d = _rpcdata();
	char *p;
	char *cp, **q;

	assert(val != NULL);

	if (d == 0)
		return (0);
	(void)strncpy(d->line, val, BUFSIZ);
	d->line[BUFSIZ] = '\0';
	p = d->line;
	p[len] = '\n';
	if (*p == '#')
		return (getrpcent());
	cp = strpbrk(p, "#\n");
	if (cp == NULL)
		return (getrpcent());
	*cp = '\0';
	cp = strpbrk(p, " \t");
	if (cp == NULL)
		return (getrpcent());
	*cp++ = '\0';
	/* THIS STUFF IS INTERNET SPECIFIC */
	d->rpc.r_name = d->line;
	while (*cp == ' ' || *cp == '\t')
		cp++;
	d->rpc.r_number = atoi(cp);
	q = d->rpc.r_aliases = d->rpc_aliases;
	cp = strpbrk(cp, " \t");
	if (cp != NULL)
		*cp++ = '\0';
	while (cp && *cp) {
		if (*cp == ' ' || *cp == '\t') {
			cp++;
			continue;
		}
		if (q < &(d->rpc_aliases[MAXALIASES - 1]))
			*q++ = cp;
		cp = strpbrk(cp, " \t");
		if (cp != NULL)
			*cp++ = '\0';
	}
	*q = NULL;
	return (&d->rpc);
}